

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

WriteThirdPartyDescriptorResult * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcClient::writeThirdPartyDescriptor
          (WriteThirdPartyDescriptorResult *__return_storage_ptr__,RpcClient *this,
          Connection *provider,Connection *recipient,Builder contact)

{
  uint *puVar1;
  RpcConnectionState *pRVar2;
  long *plVar3;
  undefined8 uVar4;
  Question *pQVar5;
  QuestionRef *pQVar6;
  Refcounted *refcounted_1;
  QuestionRef *pQVar7;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> otherMsg;
  QuestionId questionId;
  Builder provide;
  Builder result;
  undefined8 *local_138;
  long *local_130;
  SegmentBuilder *local_128;
  CapTableBuilder *pCStack_120;
  WirePointer *local_118;
  WriteThirdPartyDescriptorResult *local_110;
  QuestionId local_104;
  StructBuilder local_100;
  undefined1 local_d8 [24];
  Connection *local_c0;
  SegmentBuilder *local_b8;
  CapTableBuilder *pCStack_b0;
  WirePointer *local_a8;
  StructBuilder local_98;
  PointerBuilder local_70;
  StructBuilder local_58;
  
  local_110 = __return_storage_ptr__;
  local_c0 = recipient;
  pQVar5 = anon_unknown_18::
           ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::
           nextHigh(&((this->connectionState).ptr)->questions,&local_104);
  pQVar5->isAwaitingReturn = false;
  pRVar2 = (this->connectionState).ptr;
  pQVar6 = (QuestionRef *)operator_new(0x38);
  (pQVar6->super_Refcounted).refcount = 0;
  (pQVar6->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006f9b48
  ;
  puVar1 = &(pRVar2->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  (pQVar6->connectionState).ptr.disposer = &(pRVar2->super_Refcounted).super_Disposer;
  (pQVar6->connectionState).ptr.ptr = pRVar2;
  pQVar6->id = local_104;
  (pQVar6->fulfiller).ptr.disposer = (Disposer *)0x0;
  (pQVar6->fulfiller).ptr.ptr =
       (PromiseFulfiller<kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>_>
        *)0x0;
  (pQVar6->super_Refcounted).refcount = 1;
  (pQVar5->selfRef).ptr = pQVar6;
  (**provider->_vptr_Connection)(&local_138,provider,0x26);
  (**(code **)*local_130)(&local_128);
  local_d8._16_8_ = local_118;
  local_d8._0_8_ = local_128;
  local_d8._8_8_ = pCStack_120;
  PointerBuilder::initStruct(&local_100,(PointerBuilder *)local_d8,(StructSize)0x10001);
  *(undefined2 *)local_100.data = 10;
  local_d8._0_8_ = local_100.segment;
  local_d8._8_8_ = local_100.capTable;
  local_d8._16_8_ = local_100.pointers;
  PointerBuilder::initStruct(&local_98,(PointerBuilder *)local_d8,(StructSize)0x20001);
  *(QuestionId *)local_98.data = local_104;
  local_100.segment = local_98.segment;
  local_100.capTable = local_98.capTable;
  local_100.data = local_98.pointers;
  PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_100,(StructSize)0x10001);
  (*(this->super_ClientHook)._vptr_ClientHook[10])(local_d8,this);
  uVar4 = local_d8._8_8_;
  pQVar7 = (QuestionRef *)local_d8._8_8_;
  if ((QuestionRef *)local_d8._8_8_ != (QuestionRef *)0x0) {
    local_110->tag = 2;
    *(undefined8 *)&local_110->field_1 = local_d8._0_8_;
    *(undefined8 *)((long)&local_110->field_1 + 8) = local_d8._8_8_;
    pQVar7 = (QuestionRef *)0x0;
  }
  if (pQVar7 != (QuestionRef *)0x0) {
    (*(code *)((SegmentReader *)local_d8._0_8_)->arena->_vptr_Arena)
              (local_d8._0_8_,
               (pQVar7->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
               (long)&(pQVar7->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  pQVar7 = pQVar6;
  if ((QuestionRef *)uVar4 == (QuestionRef *)0x0) {
    local_a8 = contact.builder.pointer;
    local_b8 = contact.builder.segment;
    pCStack_b0 = contact.builder.capTable;
    local_70.pointer = (WirePointer *)&((SegmentReader *)&(local_98.pointers)->offsetAndKind)->id;
    local_70.segment = local_98.segment;
    local_70.capTable = local_98.capTable;
    PointerBuilder::clear(&local_70);
    (*local_c0->_vptr_Connection[7])(local_c0,provider);
    (**(code **)(*local_130 + 0x10))();
    (*(this->super_ClientHook)._vptr_ClientHook[4])(&local_100,this);
    local_d8._0_4_ = 1;
    local_d8._8_8_ = pQVar6;
    local_d8._16_8_ = pQVar6;
    kj::heap<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo>
              ((kj *)&local_128,(VineInfo *)local_d8);
    local_110->tag = 1;
    *(SegmentBuilder **)&local_110->field_1 = local_100.segment;
    *(CapTableBuilder **)((long)&local_110->field_1 + 8) = local_100.capTable;
    *(SegmentBuilder **)((long)&local_110->field_1 + 0x10) = local_128;
    *(CapTableBuilder **)((long)&local_110->field_1 + 0x18) = pCStack_120;
    local_100.pointers = (WirePointer *)0x0;
    local_100.data = local_128;
    local_100.capTable = (CapTableBuilder *)0x0;
    pCStack_120 = (CapTableBuilder *)0x0;
    kj::
    OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
    ::destroy((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
               *)local_d8);
    pQVar7 = (QuestionRef *)0x0;
  }
  plVar3 = local_130;
  if (local_130 != (long *)0x0) {
    local_130 = (long *)0x0;
    (**(code **)*local_138)(local_138,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if (pQVar7 != (QuestionRef *)0x0) {
    (**(pQVar6->super_Refcounted).super_Disposer._vptr_Disposer)
              (pQVar6,(pQVar7->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pQVar7->super_Refcounted).super_Disposer._vptr_Disposer);
  }
  return local_110;
}

Assistant:

virtual WriteThirdPartyDescriptorResult writeThirdPartyDescriptor(
          VatNetworkBase::Connection& provider,
          VatNetworkBase::Connection& recipient,
          AnyPointer::Builder contact) {
      // Called to fill in a ThirdPartyCapDescriptor when sending this capability to a different
      // connection.
      //
      // `provider` is this object's backing connection; the caller has already verified it is
      // currently connected. (Calling connectionState->tryGetConnection() would return the same
      // object.)
      //
      // `recipient` is the connection receiving the ThirdPartyCapDescriptor.
      //
      // `contact` is the ThirdPartyToContact which goes in the descriptor.
      //
      // Returns the ClientHook which should be used as the "vine". This needs to be callable as
      // a stand-in for the object. It also needs to hold open the `Provide` operation until the
      // returned reference is dropped. Note that `addRef()`s on the returned reference do NOT have
      // to hold open the Provide; the Provide can be held open by an attachment on the ref itself.
      //
      // The default implementation of this method is appropriate most of the time. It is
      // overridded for the specific case of `DeferredThirdPartyClient`.

      // Send `Provide` message to our connection.
      QuestionId questionId;
      auto& question = connectionState->questions.nextHigh(questionId);
      question.isAwaitingReturn = false;  // No Return needed
      auto questionRef = kj::refcounted<QuestionRef>(*connectionState, questionId, kj::none);
      question.selfRef = *questionRef;

      auto otherMsg = provider.newOutgoingMessage(messageSizeHint<rpc::Provide>() + 32);
      auto provide = otherMsg->getBody().initAs<rpc::Message>().initProvide();
      provide.setQuestionId(questionId);
      KJ_IF_SOME(redirect, writeTarget(provide.initTarget())) {
        // Oops, this capability was redirected. This *shouldn't* happen since the immediate
        // caller of writeThirdPartyDescriptor() would have already followed redirects, but as it
        // happens, if we simply return the redirect here (without filling in `contact`), we are
        // honoring our contract.
        return kj::mv(redirect);
      }
      recipient.introduceTo(provider, contact, provide.initRecipient());
      otherMsg->send();

      return VineToExport {
        .vine = addRef(),
        .vineInfo = kj::heap(VineInfo { .info = kj::mv(questionRef) })
      };
    }